

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O0

void __thiscall flow::util::Flags::Error::Error(Error *this,ErrorCode code,string *arg)

{
  FlagsErrorCategory *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view format_str;
  string local_70 [32];
  basic_string_view<char> local_50;
  string local_40;
  string *local_20;
  string *arg_local;
  Error *pEStack_10;
  ErrorCode code_local;
  Error *this_local;
  
  local_20 = arg;
  arg_local._4_4_ = code;
  pEStack_10 = this;
  fmt::v5::basic_string_view<char>::basic_string_view(&local_50,"{}: {}");
  pFVar1 = FlagsErrorCategory::get();
  (**(code **)((long)*pFVar1 + 0x20))(local_70,pFVar1,arg_local._4_4_);
  format_str.size_ = (size_t)local_70;
  format_str.data_ = (char *)local_50.size_;
  fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,(v5 *)local_50.data_,format_str,arg,in_R9);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string(local_70);
  *(undefined ***)this = &PTR__Error_002cb538;
  this->code_ = arg_local._4_4_;
  std::__cxx11::string::string((string *)&this->arg_,(string *)arg);
  return;
}

Assistant:

Flags::Error::Error(ErrorCode code, std::string arg)
    : std::runtime_error{fmt::format("{}: {}", 
          FlagsErrorCategory::get().message(static_cast<int>(code)), arg)},
      code_{code},
      arg_{std::move(arg)} {
}